

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoostTestApprovalTestsTests.cpp
# Opt level: O0

void SuiteName::NestedSuiteName::TestCaseName_invoker(void)

{
  basic_wrap_stringstream<char> *pbVar1;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *file;
  basic_wrap_stringstream<char> *line_num;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  basic_wrap_stringstream<char> *this_00;
  basic_wrap_stringstream<char> *s;
  TestCaseName t;
  char (*in_stack_fffffffffffff618) [19];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff620;
  std_string *in_stack_fffffffffffff628;
  basic_cstring<const_char> *in_stack_fffffffffffff630;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff640;
  const_string *in_stack_fffffffffffff658;
  size_t in_stack_fffffffffffff660;
  const_string *in_stack_fffffffffffff668;
  unit_test_log_t *in_stack_fffffffffffff670;
  basic_wrap_stringstream<char> local_8c0;
  basic_cstring<const_char> local_718;
  undefined1 local_701;
  basic_wrap_stringstream<char> local_700;
  basic_cstring<const_char> local_558;
  undefined1 local_541;
  basic_wrap_stringstream<char> local_540;
  basic_cstring<const_char> local_398;
  undefined1 local_381;
  basic_wrap_stringstream<char> local_380;
  basic_cstring<const_char> local_1d8;
  undefined1 local_1c5;
  basic_wrap_stringstream<char> local_1b8;
  basic_cstring<const_char> local_10;
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/Boost_Tests/BoostTestApprovalTestsTests.cpp"
             ,0x7d);
  memset(&local_1b8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_1b8);
  local_1c5 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
             in_stack_fffffffffffff658);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/Boost_Tests/BoostTestApprovalTestsTests.cpp"
             ,0x7d);
  memset(&local_380,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_380);
  local_381 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [16])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
             in_stack_fffffffffffff658);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::setup_conditional<SuiteName::NestedSuiteName::TestCaseName>
            ((TestCaseName *)in_stack_fffffffffffff620);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_398,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/Boost_Tests/BoostTestApprovalTestsTests.cpp"
             ,0x7d);
  memset(&local_540,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_540);
  local_541 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  pbVar1 = boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
             in_stack_fffffffffffff658);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  TestCaseName::test_method((TestCaseName *)pbVar1);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_558,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/Boost_Tests/BoostTestApprovalTestsTests.cpp"
             ,0x7d);
  memset(&local_700,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_700);
  local_701 = 0x22;
  this = boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  file = boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  line_num = boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  msg = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::teardown_conditional<SuiteName::NestedSuiteName::TestCaseName>
            ((TestCaseName *)in_stack_fffffffffffff620);
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_718,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/Boost_Tests/BoostTestApprovalTestsTests.cpp"
             ,0x7d);
  memset(&local_8c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_8c0);
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  this_00 = boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  s = boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  pbVar1 = (basic_wrap_stringstream<char> *)
           boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar1);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(pbVar1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(TestCaseName)
{
    Approvals::verify("hello");
}